

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f wi)

{
  Point3f *pPVar1;
  Point3<float> p;
  Point3<float> p_00;
  Point3<float> p_01;
  undefined1 auVar2 [16];
  initializer_list<float> v_00;
  span<const_float> w_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Normal3<float> n;
  Point3<float> p2_00;
  Normal3<float> n_00;
  Normal3<float> n_01;
  Normal3<float> n_02;
  Normal3<float> n_03;
  undefined1 auVar3 [16];
  Normal3<float> c;
  bool bVar4;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar5;
  ShapeIntersection *pSVar6;
  span<const_float> *this_00;
  long in_RSI;
  long in_RDI;
  Float FVar7;
  type tVar8;
  float fVar9;
  undefined8 uVar21;
  undefined1 in_ZMM0 [64];
  undefined1 auVar22 [56];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined4 in_XMM1_Da;
  Point3f PVar23;
  Vector3<float> VVar24;
  array<float,_4> w;
  Vector3f wi_1 [3];
  Point3f in_stack_00000368;
  Point3f rp;
  Point2f u;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Float pdf;
  Float pdf_1;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Float solidAngle;
  float in_stack_fffffffffffff8f8;
  float in_stack_fffffffffffff8fc;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffff900;
  Point3<float> *in_stack_fffffffffffff908;
  array<float,_4> *v_05;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  float in_stack_fffffffffffff928;
  array<float,_4> *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  undefined4 in_stack_fffffffffffff940;
  float in_stack_fffffffffffff944;
  Tuple2<pbrt::Point2,_float> p_02;
  initializer_list<pbrt::Point3<float>_> in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff958;
  float in_stack_fffffffffffff960;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffff978;
  ShapeSampleContext *in_stack_fffffffffffff988;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffff9a0;
  type local_608;
  float local_604;
  undefined8 local_600;
  float local_5f8;
  Triangle *in_stack_fffffffffffffa10;
  type local_5c0;
  float local_5bc;
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  undefined4 local_5a0;
  undefined8 local_598;
  float local_590;
  undefined8 local_588;
  undefined4 local_580;
  type local_578;
  float local_574;
  undefined8 local_570;
  float local_568;
  undefined8 local_560;
  undefined4 local_558;
  undefined8 local_550;
  float local_548;
  Triangle *in_stack_fffffffffffffac0;
  type local_530;
  float local_52c;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  float in_stack_fffffffffffffae0;
  array<float,_4> local_508;
  undefined8 local_4f8;
  float local_4f0;
  undefined8 local_4e8;
  float local_4e0;
  undefined8 local_4d8;
  float local_4d0;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3cc;
  float local_3c4;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  Triangle *in_stack_fffffffffffffc68;
  undefined8 local_338;
  float local_330;
  undefined8 local_32c;
  float local_324;
  undefined8 local_320;
  float local_318;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  int *local_2a0;
  TriangleMesh *local_298;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  float local_274;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  float local_1b8;
  undefined4 local_1b4;
  optional local_1b0 [264];
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  Float local_34;
  long local_30;
  undefined8 local_20;
  undefined8 local_10;
  undefined4 local_8;
  float local_4;
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  
  FVar7 = (Float)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  auVar22 = in_ZMM0._8_56_;
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = in_RSI;
  local_10 = local_20;
  local_8 = in_XMM1_Da;
  PVar23 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  local_58 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar22;
  local_60 = vmovlpd_avx(auVar10._0_16_);
  PVar23.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffadc;
  PVar23.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffad8;
  PVar23.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffae0;
  local_50 = local_60;
  local_48 = local_58;
  local_40 = local_60;
  local_38 = local_58;
  local_34 = SolidAngle(in_stack_fffffffffffffac0,PVar23);
  if ((local_34 < 0.0003) || (6.22 < local_34)) {
    local_90 = local_8;
    local_98 = local_10;
    local_a0 = local_8;
    local_a8 = local_10;
    ShapeSampleContext::SpawnRay(in_stack_fffffffffffff988,(Vector3f)in_stack_fffffffffffff9a0);
    Intersect(in_stack_fffffffffffffc68,
              (Ray *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),FVar7);
    bVar4 = pstd::optional::operator_cast_to_bool(local_1b0);
    if (bVar4) {
      FVar7 = Area(in_stack_fffffffffffffa10);
      uVar21 = 0;
      pSVar6 = pstd::optional<pbrt::ShapeIntersection>::operator->
                         ((optional<pbrt::ShapeIntersection> *)0x6e54b1);
      local_1c8 = (pSVar6->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_1d0._0_4_ = (pSVar6->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_1d0._4_4_ = (pSVar6->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
      VVar24 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffff900);
      local_208 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar3._8_8_ = uVar21;
      auVar3._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_210 = vmovlpd_avx(auVar3);
      local_1f8 = local_1c8;
      local_200 = local_1d0;
      n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff960;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      n.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      VVar24.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff940;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff93c;
      VVar24.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff944;
      local_1f0 = local_210;
      local_1e8 = local_208;
      local_1e0 = local_210;
      local_1d8 = local_208;
      tVar8 = AbsDot<float>(n,VVar24);
      auVar22 = extraout_var;
      PVar23 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      fVar9 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar11._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar11._8_56_ = auVar22;
      uVar21 = 0;
      local_230 = vmovlpd_avx(auVar11._0_16_);
      local_228 = fVar9;
      local_220 = local_230;
      local_218 = fVar9;
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x6e5601);
      PVar23 = Interaction::p((Interaction *)CONCAT44(fVar9,in_stack_fffffffffffff940));
      local_268 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar2._8_8_ = uVar21;
      auVar2._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_270 = vmovlpd_avx(auVar2);
      local_258 = local_218;
      local_260 = local_220;
      p2_00.super_Tuple3<pbrt::Point3,_float>.z = tVar8;
      p2_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      p2_00.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      local_250 = local_270;
      local_248 = local_268;
      local_240 = local_270;
      local_238 = local_268;
      fVar9 = DistanceSquared<float>((Point3<float>)in_stack_fffffffffffff978,p2_00);
      local_1b8 = (1.0 / FVar7) / (tVar8 / fVar9);
      eVar5 = IsInf<float>(0.0);
      if (eVar5) {
        local_1b8 = 0.0;
      }
      local_4 = local_1b8;
    }
    else {
      local_4 = 0.0;
    }
    local_1b4 = 1;
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x6e576c);
  }
  else {
    local_274 = 1.0 / local_34;
    this_00 = (span<const_float> *)(local_30 + 0x24);
    Normal3<float>::Normal3
              ((Normal3<float> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f8,0.0);
    local_288 = local_278;
    local_290 = local_280;
    c.super_Tuple3<pbrt::Normal3,_float>.z = local_278;
    c.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_280;
    c.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_280._4_4_;
    auVar22 = (undefined1  [56])0x0;
    bVar4 = Tuple3<pbrt::Normal3,_float>::operator!=((Tuple3<pbrt::Normal3,_float> *)this_00,c);
    if (bVar4) {
      local_298 = GetMesh((Triangle *)0x6e5809);
      local_2a0 = local_298->vertexIndices + *(int *)(in_RDI + 4) * 3;
      local_330 = local_298->p[*local_2a0].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_298->p + *local_2a0;
      local_338._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_338._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_324 = local_298->p[local_2a0[1]].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_298->p + local_2a0[1];
      local_32c._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_32c._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_318 = local_298->p[local_2a0[2]].super_Tuple3<pbrt::Point3,_float>.z;
      pPVar1 = local_298->p + local_2a0[2];
      local_320._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      local_320._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      local_310 = &local_338;
      local_308 = 3;
      local_2d0 = local_320;
      local_2c8 = local_318;
      local_2c0 = local_32c;
      local_2b8 = local_324;
      local_2b0 = local_338;
      local_2a8 = local_330;
      pstd::array<pbrt::Point3<float>,_3>::array
                ((array<pbrt::Point3<float>,_3> *)
                 CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff948);
      PVar23 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      auVar12._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar12._8_56_ = auVar22;
      vmovlpd_avx(auVar12._0_16_);
      auVar13._0_8_ =
           InvertSphericalTriangleSample
                     ((array<pbrt::Point3<float>,_3> *)
                      wi_1[0].super_Tuple3<pbrt::Vector3,_float>._0_8_,in_stack_00000368,wi_1[2]);
      auVar13._8_56_ = extraout_var_00;
      local_2d8 = vmovlpd_avx(auVar13._0_16_);
      auVar22 = extraout_var_00;
      PVar23 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      fVar9 = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar14._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar22;
      local_408 = vmovlpd_avx(auVar14._0_16_);
      auVar22 = ZEXT856(0);
      p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff924;
      p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff920;
      p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff928;
      local_400 = fVar9;
      local_3f8 = local_408;
      local_3f0 = fVar9;
      uVar21 = local_408;
      VVar24 = Point3<float>::operator-(in_stack_fffffffffffff908,p);
      local_420 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar22;
      local_428 = vmovlpd_avx(auVar15._0_16_);
      auVar22 = ZEXT856(0);
      local_418 = local_428;
      local_410 = local_420;
      local_3e8 = local_428;
      local_3e0 = local_420;
      local_468 = uVar21;
      VVar24 = Normalize<float>(in_stack_fffffffffffff948._0_12_);
      local_430 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar22;
      local_438 = vmovlpd_avx(auVar16._0_16_);
      auVar22 = ZEXT856(0);
      p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff924;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff920;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff928;
      local_460 = fVar9;
      local_458 = local_468;
      local_450 = fVar9;
      local_3d8 = local_438;
      local_3d0 = local_430;
      uVar21 = local_468;
      VVar24 = Point3<float>::operator-(in_stack_fffffffffffff908,p_00);
      local_480 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar22;
      local_488 = vmovlpd_avx(auVar17._0_16_);
      auVar22 = ZEXT856(0);
      local_478 = local_488;
      local_470 = local_480;
      local_448 = local_488;
      local_440 = local_480;
      local_4c8 = uVar21;
      VVar24 = Normalize<float>(in_stack_fffffffffffff948._0_12_);
      local_490 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar22;
      local_498 = vmovlpd_avx(auVar18._0_16_);
      auVar22 = ZEXT856(0);
      p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff924;
      p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff920;
      p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff928;
      local_4c0 = fVar9;
      local_4b8 = local_4c8;
      local_4b0 = fVar9;
      local_3cc = local_498;
      local_3c4 = local_490;
      VVar24 = Point3<float>::operator-(in_stack_fffffffffffff908,p_01);
      local_4e0 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar22;
      local_4e8 = vmovlpd_avx(auVar19._0_16_);
      auVar22 = ZEXT856(0);
      local_4d8 = local_4e8;
      local_4d0 = local_4e0;
      local_4a8 = local_4e8;
      local_4a0 = local_4e0;
      VVar24 = Normalize<float>(in_stack_fffffffffffff948._0_12_);
      p_02 = in_stack_fffffffffffff948._4_8_;
      local_4f0 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar22;
      local_4f8 = vmovlpd_avx(auVar20._0_16_);
      local_52c = 0.01;
      local_558 = *(undefined4 *)(local_30 + 0x2c);
      local_560 = *(undefined8 *)(local_30 + 0x24);
      local_548 = local_3c4;
      local_550 = local_3cc;
      local_568 = local_3c4;
      local_570 = local_3cc;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff960;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      n_00.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff940;
      v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff93c;
      v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff944;
      local_3c0 = local_4f8;
      local_3b8 = local_4f0;
      local_530 = AbsDot<float>(n_00,v_01);
      std::max<float>(&local_52c,&local_530);
      local_574 = 0.01;
      local_5a0 = *(undefined4 *)(local_30 + 0x2c);
      local_5a8 = *(undefined8 *)(local_30 + 0x24);
      local_590 = local_3c4;
      local_598 = local_3cc;
      local_5b0 = local_3c4;
      local_5b8 = local_3cc;
      n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff960;
      n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      n_01.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      v_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff940;
      v_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff93c;
      v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff944;
      local_588 = local_5a8;
      local_580 = local_5a0;
      local_578 = AbsDot<float>(n_01,v_02);
      std::max<float>(&local_574,&local_578);
      local_5bc = 0.01;
      local_5f8 = local_3d0;
      local_600 = local_3d8;
      n_02.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff960;
      n_02.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      n_02.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      v_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff940;
      v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff93c;
      v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff944;
      local_5c0 = AbsDot<float>(n_02,v_03);
      std::max<float>(&local_5bc,&local_5c0);
      local_604 = 0.01;
      n_03.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff960;
      n_03.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff958;
      n_03.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff958 >> 0x20);
      v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff940;
      v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff93c;
      v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff944;
      local_608 = AbsDot<float>(n_03,v_04);
      std::max<float>(&local_604,&local_608);
      v_05 = &local_508;
      v_00._M_array._4_4_ = in_stack_fffffffffffff93c;
      v_00._M_array._0_4_ = in_stack_fffffffffffff938;
      v_00._M_len._0_4_ = in_stack_fffffffffffff940;
      v_00._M_len._4_4_ = in_stack_fffffffffffff944;
      pstd::array<float,_4>::array(in_stack_fffffffffffff930,v_00);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>(this_00,v_05);
      w_00.ptr._4_4_ = in_stack_fffffffffffff93c;
      w_00.ptr._0_4_ = in_stack_fffffffffffff938;
      w_00.n._0_4_ = in_stack_fffffffffffff940;
      w_00.n._4_4_ = in_stack_fffffffffffff944;
      FVar7 = BilinearPDF((Point2f)p_02,w_00);
      local_274 = FVar7 * local_274;
    }
    local_4 = local_274;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos\theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos\theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }